

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O1

int SMPI_Gatherv(void *sendbuf,int sendcount,SMPI_Datatype sendtype,void *recvbuf,size_t *recvcounts
                ,size_t *displs,SMPI_Datatype recvtype,int root,SMPI_Comm comm)

{
  long *plVar1;
  Datatype DVar2;
  Datatype DVar3;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  switch(sendtype) {
  case SMPI_INT:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_0011a02d_default;
    }
    break;
  case SMPI_LONG:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_0011a02d_default;
    }
    break;
  case SMPI_SIZE_T:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_0011a02d_default;
    }
    break;
  case SMPI_CHAR:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_0011a02d_default;
    }
    break;
  case SMPI_BYTE:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (**(code **)(*plVar1 + 0x80))
                (plVar1,sendbuf,(long)sendcount,DVar2,recvbuf,recvcounts,displs,DVar3,root,&local_50
                );
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_0011a02d_default;
    }
    break;
  default:
    goto switchD_0011a02d_default;
  }
  operator_delete(local_50);
switchD_0011a02d_default:
  return 0;
}

Assistant:

int SMPI_Gatherv(const void *sendbuf, int sendcount, SMPI_Datatype sendtype, void *recvbuf,
                 const size_t *recvcounts, const size_t *displs, SMPI_Datatype recvtype, int root,
                 SMPI_Comm comm)
{
    int ret = 0;
    switch (sendtype)
    {
#define F(type)                                                                                    \
    ret = SMPI_Gatherv_Impl(static_cast<const type *>(sendbuf), sendcount, recvbuf, recvcounts,    \
                            displs, recvtype, root, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return ret;
}